

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O1

void render_url_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  byte bVar1;
  long lVar2;
  undefined8 in_RAX;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  MD_SIZE MVar8;
  ulong uVar9;
  char *pcVar10;
  bool bVar11;
  char hex [3];
  undefined8 uStack_38;
  
  uVar6 = 0;
  uStack_38 = in_RAX;
  do {
    uVar9 = (ulong)uVar6;
    bVar11 = uVar6 < size;
    uVar5 = uVar6;
    if ((bVar11) && (uVar7 = uVar9, (r->escape_map[(byte)data[uVar9]] & 2U) == 0)) {
      do {
        iVar3 = (int)uVar7;
        if (size - 1 == iVar3) {
          uVar7 = (ulong)size;
          break;
        }
        lVar2 = uVar7 + 1;
        uVar7 = uVar7 + 1;
      } while ((r->escape_map[(byte)data[lVar2]] & 2U) == 0);
      bVar11 = iVar3 + 1U < size;
      uVar5 = (uint)uVar7;
    }
    if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
      (*r->process_output)(data + uVar9,uVar5 - uVar6,r->userdata);
    }
    if (!bVar11) {
      return;
    }
    bVar1 = data[uVar5];
    if (bVar1 == 0x26) {
      pvVar4 = r->userdata;
      pcVar10 = "&amp;";
      MVar8 = 5;
    }
    else {
      uStack_38 = CONCAT17("0123456789ABCDEF"[bVar1 & 0xf],
                           CONCAT16("0123456789ABCDEF"[bVar1 >> 4],
                                    CONCAT15(0x25,(undefined5)uStack_38)));
      pvVar4 = r->userdata;
      pcVar10 = (char *)((long)&uStack_38 + 5);
      MVar8 = 3;
    }
    (*r->process_output)(pcVar10,MVar8,pvVar4);
    uVar6 = uVar5 + 1;
  } while( true );
}

Assistant:

static void
render_url_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    static const MD_CHAR hex_chars[] = "0123456789ABCDEF";
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in URL attributes. */
    #define NEED_URL_ESC(ch)    (r->escape_map[(unsigned char)(ch)] & NEED_URL_ESC_FLAG)

    while(1) {
        while(off < size  &&  !NEED_URL_ESC(data[off]))
            off++;
        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            char hex[3];

            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                default:
                    hex[0] = '%';
                    hex[1] = hex_chars[((unsigned)data[off] >> 4) & 0xf];
                    hex[2] = hex_chars[((unsigned)data[off] >> 0) & 0xf];
                    render_verbatim(r, hex, 3);
                    break;
            }
            off++;
        } else {
            break;
        }

        beg = off;
    }
}